

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_stricmp(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    cVar1 = s1[lVar3];
    iVar2 = (int)cVar1 - (int)s2[lVar3];
    if (((iVar2 != 0) && ((0x19 < (byte)(cVar1 + 0xbfU) || (iVar2 = iVar2 + 0x20, iVar2 != 0)))) &&
       ((0x19 < (byte)(s2[lVar3] + 0xbfU) || (iVar2 = iVar2 + -0x20, iVar2 != 0)))) break;
    lVar3 = lVar3 + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  return iVar2 >> 0x1f | 1;
}

Assistant:

NK_API int
nk_stricmp(const char *s1, const char *s2)
{
    nk_int c1,c2,d;
    do {
        c1 = *s1++;
        c2 = *s2++;
        d = c1 - c2;
        while (d) {
            if (c1 <= 'Z' && c1 >= 'A') {
                d += ('a' - 'A');
                if (!d) break;
            }
            if (c2 <= 'Z' && c2 >= 'A') {
                d -= ('a' - 'A');
                if (!d) break;
            }
            return ((d >= 0) << 1) - 1;
        }
    } while (c1);
    return 0;
}